

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

TIntermAggregate * __thiscall
glslang::HlslParseContext::handleSamplerTextureCombine
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *argTex,TIntermTyped *argSampler)

{
  _Rb_tree_header *p_Var1;
  TMap<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>_>
  *this_00;
  int iVar2;
  TPoolAllocator *pTVar3;
  TIntermAggregate *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint *puVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long *plVar5;
  long lVar6;
  long lVar7;
  mapped_type ptVar8;
  mapped_type *pptVar9;
  undefined4 extraout_var_05;
  TVariable *pTVar10;
  undefined4 extraout_var_06;
  _Base_ptr p_Var11;
  undefined4 extraout_var_07;
  uint uVar12;
  ulong uVar13;
  _Base_ptr p_Var14;
  uint uVar15;
  longlong newId;
  TType texType;
  long local_f8;
  ulong local_f0;
  TMap<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>_>
  *local_e8;
  TIntermTyped *local_e0;
  TSourceLoc *local_d8;
  ulong local_d0;
  undefined1 local_c8 [24];
  ulong uStack_b0;
  undefined1 local_a8;
  int local_a4;
  int local_a0;
  undefined8 local_9c;
  undefined8 local_94;
  undefined1 local_8c;
  undefined4 local_8b;
  int local_84;
  undefined4 local_80;
  int local_7c;
  TSpirvDecorate *local_78;
  undefined2 local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  TSampler local_48;
  undefined1 local_40 [16];
  
  pTVar3 = GetThreadPoolAllocator();
  this_01 = (TIntermAggregate *)TPoolAllocator::allocate(pTVar3,0x188);
  TIntermAggregate::TIntermAggregate(this_01,EOpConstructTextureSampler);
  iVar2 = (*(this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(this_01);
  local_c8._0_8_ = argTex;
  std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::emplace_back<TIntermNode*>
            ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
             CONCAT44(extraout_var,iVar2),(TIntermNode **)local_c8);
  iVar2 = (*(this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(this_01);
  local_c8._0_8_ = argSampler;
  std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::emplace_back<TIntermNode*>
            ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
             CONCAT44(extraout_var_00,iVar2),(TIntermNode **)local_c8);
  iVar2 = (*(argTex->super_TIntermNode)._vptr_TIntermNode[0x1e])(argTex);
  puVar4 = (uint *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x40))
                             ((long *)CONCAT44(extraout_var_01,iVar2));
  local_d0 = (ulong)*puVar4;
  iVar2 = (*(argSampler->super_TIntermNode)._vptr_TIntermNode[0x1e])(argSampler);
  puVar4 = (uint *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x40))
                             ((long *)CONCAT44(extraout_var_02,iVar2));
  uVar12 = *puVar4;
  iVar2 = (*(argTex->super_TIntermNode)._vptr_TIntermNode[0xc])(argTex);
  plVar5 = (long *)CONCAT44(extraout_var_03,iVar2);
  if (plVar5 == (long *)0x0) {
    iVar2 = (*(argTex->super_TIntermNode)._vptr_TIntermNode[8])(argTex);
    plVar5 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 400))
                               ((long *)CONCAT44(extraout_var_04,iVar2));
    plVar5 = (long *)(**(code **)(*plVar5 + 0x60))(plVar5);
    if (plVar5 == (long *)0x0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"unable to find texture symbol","","");
      return (TIntermAggregate *)0x0;
    }
  }
  local_f0 = (ulong)(uVar12 & 0x20000);
  lVar6 = (**(code **)(*plVar5 + 0x180))(plVar5);
  local_e8 = &this->textureShadowVariant;
  local_f8 = lVar6;
  lVar7 = (**(code **)(*plVar5 + 0x180))(plVar5);
  p_Var11 = (this->textureShadowVariant).
            super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
            ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->textureShadowVariant).
            super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  p_Var14 = &p_Var1->_M_header;
  local_d8 = loc;
  if (p_Var11 == (_Base_ptr)0x0) {
LAB_00385a7e:
    local_e0 = argTex;
    pTVar3 = GetThreadPoolAllocator();
    ptVar8 = (mapped_type)TPoolAllocator::allocate(pTVar3,0x10);
    *(undefined4 *)(ptVar8->symId)._M_elems = 0xffffffff;
    *(undefined4 *)((long)(ptVar8->symId)._M_elems + 4) = 0xffffffff;
    *(undefined4 *)((ptVar8->symId)._M_elems + 1) = 0xffffffff;
    *(undefined4 *)((long)(ptVar8->symId)._M_elems + 0xc) = 0xffffffff;
    local_c8._0_8_ = (**(code **)(*plVar5 + 0x180))(plVar5);
    pptVar9 = std::
              map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
              ::operator[](&local_e8->
                            super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                           ,(key_type_conflict2 *)local_c8);
    *pptVar9 = ptVar8;
    argTex = local_e0;
  }
  else {
    do {
      if (lVar7 <= *(long *)(p_Var11 + 1)) {
        p_Var14 = p_Var11;
      }
      p_Var11 = (&p_Var11->_M_left)[*(long *)(p_Var11 + 1) < lVar7];
    } while (p_Var11 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var14 == p_Var1) || (lVar7 < *(long *)(p_Var14 + 1)))
    goto LAB_00385a7e;
    lVar6 = *(long *)(&(p_Var14[1]._M_parent)->_M_color + (local_f0 >> 0x11 & 0x7fff) * 2);
    local_f8 = lVar6;
  }
  if (lVar6 == -1) {
    TType::TType((TType *)local_c8,EbtVoid,EvqTemporary,1,0,0,false);
    iVar2 = (*(argTex->super_TIntermNode)._vptr_TIntermNode[0x1e])(argTex);
    TType::shallowCopy((TType *)local_c8,(TType *)CONCAT44(extraout_var_05,iVar2));
    local_48 = (TSampler)((uint)local_48 & 0xfffdffff | (uint)local_f0);
    uVar12 = local_c8._24_4_ & 0x7f;
    if (uVar12 == 0x10) {
      uVar13 = 3;
LAB_00385b9a:
      uStack_b0 = uStack_b0 & 0xffffffffffffff80 | uVar13;
    }
    else if (uVar12 == 0x11) {
      uVar13 = 4;
      goto LAB_00385b9a;
    }
    lVar6 = (**(code **)(*plVar5 + 400))(plVar5);
    pTVar10 = makeInternalVariable(this,*(char **)(lVar6 + 8),(TType *)local_c8);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])(this,pTVar10)
    ;
    iVar2 = (*(pTVar10->super_TSymbol)._vptr_TSymbol[0xf])(pTVar10);
    lVar6 = CONCAT44(extraout_var_06,iVar2);
    local_f8 = lVar6;
    if (lVar6 == -1) {
      __assert_fail("newId != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                    ,0xd2d,
                    "TIntermAggregate *glslang::HlslParseContext::handleSamplerTextureCombine(const TSourceLoc &, TIntermTyped *, TIntermTyped *)"
                   );
    }
  }
  p_Var11 = (this->textureShadowVariant).
            super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
            ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var14 = &p_Var1->_M_header;
  if (p_Var11 != (_Base_ptr)0x0) {
    do {
      if (lVar6 <= (long)*(size_t *)(p_Var11 + 1)) {
        p_Var14 = p_Var11;
      }
      p_Var11 = (&p_Var11->_M_left)[(long)*(size_t *)(p_Var11 + 1) < lVar6];
    } while (p_Var11 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var14 != p_Var1) &&
       ((long)((_Rb_tree_header *)p_Var14)->_M_node_count <= lVar6)) goto LAB_00385c5c;
  }
  local_c8._0_8_ = (**(code **)(*plVar5 + 0x180))(plVar5);
  this_00 = local_e8;
  pptVar9 = std::
            map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
            ::operator[](&local_e8->
                          super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                         ,(key_type_conflict2 *)local_c8);
  ptVar8 = *pptVar9;
  pptVar9 = std::
            map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
            ::operator[](&this_00->
                          super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                         ,&local_f8);
  *pptVar9 = ptVar8;
LAB_00385c5c:
  pptVar9 = std::
            map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
            ::operator[](&local_e8->
                          super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                         ,&local_f8);
  uVar15 = (uint)local_f0;
  *(long *)((long)((*pptVar9)->symId)._M_elems + (local_f0 >> 0xe & 0x3ffff)) = local_f8;
  iVar2 = (*(argTex->super_TIntermNode)._vptr_TIntermNode[0x1f])(argTex);
  puVar4 = (uint *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar2) + 0x48))
                             ((long *)CONCAT44(extraout_var_07,iVar2));
  *puVar4 = *puVar4 & 0xfffdffff | uVar15;
  uVar12 = (uint)local_d0;
  (**(code **)(*plVar5 + 0x1a8))(plVar5,local_f8);
  local_c8._0_8_ = &PTR__TType_00923160;
  local_c8._8_4_ = 0x10e;
  local_68 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_40 = (undefined1  [16])0x0;
  stack0xffffffffffffff48 = (undefined1  [16])0x0;
  local_a8 = 0;
  local_a4 = -1;
  local_a0 = -1;
  local_8b._0_1_ = false;
  local_8b._1_1_ = false;
  local_8b._2_1_ = false;
  local_8b._3_1_ = false;
  local_84 = -0x800;
  local_70._0_1_ = false;
  local_70._1_1_ = false;
  local_80._0_1_ = false;
  local_80._1_1_ = false;
  local_80._2_1_ = false;
  local_80._3_1_ = false;
  local_8c = 0;
  local_9c = 0xffffffff001fcfff;
  local_94 = 0xffffffffffffffff;
  local_7c = -1;
  local_78 = (TSpirvDecorate *)0x0;
  local_48 = (TSampler)((uVar12 & 0xffedffff) + uVar15 + 0x100000);
  (*(this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
            (this_01);
  (*(this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])
            (this_01,local_d8);
  return this_01;
}

Assistant:

TIntermAggregate* HlslParseContext::handleSamplerTextureCombine(const TSourceLoc& loc, TIntermTyped* argTex,
                                                                TIntermTyped* argSampler)
{
    TIntermAggregate* txcombine = new TIntermAggregate(EOpConstructTextureSampler);

    txcombine->getSequence().push_back(argTex);
    txcombine->getSequence().push_back(argSampler);

    TSampler samplerType = argTex->getType().getSampler();
    samplerType.combined = true;

    // TODO:
    // This block exists until the spec no longer requires shadow modes on texture objects.
    // It can be deleted after that, along with the shadowTextureVariant member.
    {
        const bool shadowMode = argSampler->getType().getSampler().shadow;

        TIntermSymbol* texSymbol = argTex->getAsSymbolNode();

        if (texSymbol == nullptr)
            texSymbol = argTex->getAsBinaryNode()->getLeft()->getAsSymbolNode();

        if (texSymbol == nullptr) {
            error(loc, "unable to find texture symbol", "", "");
            return nullptr;
        }

        // This forces the texture's shadow state to be the sampler's
        // shadow state.  This depends on downstream optimization to
        // DCE one variant in [shadow, nonshadow] if both are present,
        // or the SPIR-V module would be invalid.
        long long newId = texSymbol->getId();

        // Check to see if this texture has been given a shadow mode already.
        // If so, look up the one we already have.
        const auto textureShadowEntry = textureShadowVariant.find(texSymbol->getId());

        if (textureShadowEntry != textureShadowVariant.end())
            newId = textureShadowEntry->second->get(shadowMode);
        else
            textureShadowVariant[texSymbol->getId()] = NewPoolObject(tShadowTextureSymbols(), 1);

        // Sometimes we have to create another symbol (if this texture has been seen before,
        // and we haven't created the form for this shadow mode).
        if (newId == -1) {
            TType texType;
            texType.shallowCopy(argTex->getType());
            texType.getSampler().shadow = shadowMode;  // set appropriate shadow mode.
            globalQualifierFix(loc, texType.getQualifier());

            TVariable* newTexture = makeInternalVariable(texSymbol->getName(), texType);

            trackLinkage(*newTexture);

            newId = newTexture->getUniqueId();
        }

        assert(newId != -1);

        if (textureShadowVariant.find(newId) == textureShadowVariant.end())
            textureShadowVariant[newId] = textureShadowVariant[texSymbol->getId()];

        textureShadowVariant[newId]->set(shadowMode, newId);

        // Remember this shadow mode in the texture and the merged type.
        argTex->getWritableType().getSampler().shadow = shadowMode;
        samplerType.shadow = shadowMode;

        texSymbol->switchId(newId);
    }

    txcombine->setType(TType(samplerType, EvqTemporary));
    txcombine->setLoc(loc);

    return txcombine;
}